

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

unique_ptr<pg::Game,_std::default_delete<pg::Game>_> __thiscall
pg::Game::extract_subgame
          (Game *this,bitset *mask,vector<int,_std::allocator<int>_> *subgame_to_game)

{
  pointer piVar1;
  long *plVar2;
  bool bVar3;
  string *psVar4;
  Game *this_00;
  mapped_type_conflict *pmVar5;
  size_t sVar6;
  size_t sVar7;
  ostream *poVar8;
  vector<int,_std::allocator<int>_> *in_RCX;
  int iVar9;
  size_t sVar10;
  _Alloc_hider _Var11;
  long lVar12;
  int *piVar13;
  int iVar14;
  uint64_t *puVar15;
  ulong uVar16;
  key_type_conflict1 *__k;
  bool bVar17;
  __single_object *res;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> game_to_subgame;
  value_type_conflict3 local_d8;
  int local_d4;
  size_t local_d0;
  int local_c4;
  tuple<pg::Game_*,_std::default_delete<pg::Game>_> local_c0;
  bitset *local_b8;
  vector<int,_std::allocator<int>_> *local_b0;
  ulong local_a8;
  string local_a0;
  string local_80;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_c0.super__Tuple_impl<0UL,_pg::Game_*,_std::default_delete<pg::Game>_>.
  super__Head_base<0UL,_pg::Game_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_pg::Game_*,_std::default_delete<pg::Game>_>)
       (_Tuple_impl<0UL,_pg::Game_*,_std::default_delete<pg::Game>_>)this;
  local_b0 = in_RCX;
  local_d0 = bitset::count((bitset *)subgame_to_game);
  if ((long)mask->_bits < 1) {
    iVar9 = 0;
  }
  else {
    piVar1 = (subgame_to_game->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar15 = (uint64_t *)0x0;
    iVar9 = 0;
    do {
      if ((*(ulong *)(piVar1 + ((ulong)puVar15 >> 6) * 2) >> ((ulong)puVar15 & 0x3f) & 1) != 0) {
        lVar12 = (long)*(int *)(mask[2]._size + (long)puVar15 * 4);
        iVar14 = *(int *)((long)mask[2]._bits + lVar12 * 4);
        if (iVar14 == -1) {
LAB_0013dc57:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"no successor for vertex ",0x18);
          local_60._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)puVar15;
          local_60._M_impl._0_8_ = mask;
          poVar8 = operator<<((ostream *)&std::cerr,(_label_vertex *)&local_60);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," in extract_subgame!",0x14);
          std::endl<char,std::char_traits<char>>(poVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"successors not in subgame:",0x1a);
          lVar12 = (long)*(int *)(mask[2]._size + (long)puVar15 * 4);
          if (*(int *)((long)mask[2]._bits + lVar12 * 4) != -1) {
            piVar13 = (int *)((long)mask[2]._bits + lVar12 * 4 + 4);
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
              local_60._M_impl.super__Rb_tree_header._M_header._M_color = piVar13[-1];
              local_60._M_impl._0_8_ = mask;
              operator<<((ostream *)&std::cerr,(_label_vertex *)&local_60);
              iVar9 = *piVar13;
              piVar13 = piVar13 + 1;
            } while (iVar9 != -1);
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          abort();
        }
        piVar13 = (int *)((long)mask[2]._bits + lVar12 * 4 + 4);
        bVar3 = true;
        do {
          bVar17 = (*(ulong *)(piVar1 + ((ulong)(long)iVar14 >> 6) * 2) &
                   1L << ((long)iVar14 & 0x3fU)) == 0;
          bVar3 = (bool)(bVar3 & bVar17);
          iVar14 = *piVar13;
          iVar9 = iVar9 + (uint)!bVar17;
          piVar13 = piVar13 + 1;
        } while (iVar14 != -1);
        if (bVar3) goto LAB_0013dc57;
      }
      puVar15 = (uint64_t *)((long)puVar15 + 1);
    } while (puVar15 != mask->_bits);
  }
  this_00 = (Game *)operator_new(0xaa8);
  Game(this_00,(int)local_d0,iVar9);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(long *)local_c0.super__Tuple_impl<0UL,_pg::Game_*,_std::default_delete<pg::Game>_>.
           super__Head_base<0UL,_pg::Game_*,_false>._M_head_impl = (long)this_00;
  local_d8 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(local_b0,(size_type)mask->_bits,&local_d8);
  local_d8 = 0;
  local_b8 = mask;
  if (0 < (long)mask->_bits) {
    uVar16 = 0;
    iVar9 = 0;
    do {
      if ((*(ulong *)((subgame_to_game->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start + (uVar16 >> 6) * 2) >> (uVar16 & 0x3f) & 1)
          != 0) {
        (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[iVar9] = (int)uVar16;
        pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,&local_d8);
        *pmVar5 = iVar9;
        local_d4 = iVar9 + 1;
        uVar16 = (ulong)local_d8;
        local_c4 = *(int *)(mask->_bitssize + uVar16 * 4);
        plVar2 = *(long **)(mask[1]._allocsize + uVar16 * 8);
        local_a8 = *(ulong *)(mask->_allocsize + (uVar16 >> 6) * 8);
        if (plVar2 == (long *)0x0) {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
          init_vertex(this_00,iVar9,local_c4,(uint)((local_a8 >> (uVar16 & 0x3f) & 1) != 0),
                      &local_a0);
          psVar4 = &local_a0;
          _Var11._M_p = local_a0._M_dataplus._M_p;
        }
        else {
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_80,*plVar2,plVar2[1] + *plVar2)
          ;
          init_vertex(this_00,iVar9,local_c4,(uint)((local_a8 >> (uVar16 & 0x3f) & 1) != 0),
                      &local_80);
          psVar4 = &local_80;
          _Var11._M_p = local_80._M_dataplus._M_p;
        }
        mask = local_b8;
        iVar9 = local_d4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var11._M_p != &psVar4->field_2) {
          operator_delete(_Var11._M_p,(psVar4->field_2)._M_allocated_capacity + 1);
          iVar9 = local_d4;
        }
      }
      uVar16 = (long)local_d8 + 1;
      local_d8 = (value_type_conflict3)uVar16;
    } while ((long)uVar16 < (long)mask->_bits);
  }
  if (0 < (int)(uint)local_d0) {
    sVar10 = 0;
    local_d0 = (size_t)((uint)local_d0 & 0x7fffffff);
    sVar6 = this_00->e_size;
    do {
      iVar9 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[sVar10];
      this_00->_firstouts[sVar10] = (int)sVar6;
      this_00->_outcount[sVar10] = 0;
      lVar12 = (long)*(int *)(mask[2]._size + (long)iVar9 * 4);
      iVar9 = *(int *)((long)mask[2]._bits + lVar12 * 4);
      if (iVar9 != -1) {
        __k = (key_type_conflict1 *)((long)mask[2]._bits + lVar12 * 4);
        do {
          if ((*(ulong *)((subgame_to_game->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + ((ulong)(long)iVar9 >> 6) * 2) >>
               ((long)iVar9 & 0x3fU) & 1) != 0) {
            pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)&local_60,__k);
            e_add(this_00,(int)sVar10,*pmVar5);
          }
          iVar9 = __k[1];
          __k = __k + 1;
        } while (iVar9 != -1);
        sVar6 = this_00->e_size;
        mask = local_b8;
      }
      sVar7 = sVar6;
      if (sVar6 == this_00->e_allocated) {
        e_sizeup(this_00);
        sVar7 = this_00->e_size;
      }
      sVar6 = sVar7 + 1;
      sVar10 = sVar10 + 1;
      this_00->e_size = sVar6;
      this_00->_outedges[sVar7] = -1;
    } while (sVar10 != local_d0);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return (__uniq_ptr_data<pg::Game,_std::default_delete<pg::Game>,_true,_true>)
         (tuple<pg::Game_*,_std::default_delete<pg::Game>_>)
         local_c0.super__Tuple_impl<0UL,_pg::Game_*,_std::default_delete<pg::Game>_>.
         super__Head_base<0UL,_pg::Game_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Game>
Game::extract_subgame(const bitset& mask, std::vector<int>& subgame_to_game)
{
    // check if there are any dead ends (not allowed)
    // also count the number of edges in the subgame

    int nv = mask.count();
    int ne = 0;
    for (int v=0; v<n_vertices; v++) {
        if (mask[v]) {
            bool bad = true;
            for (auto curedge = outs(v); *curedge != -1; curedge++) {
                if (mask[*curedge]) {
                    bad = false;
                    ne++;
                }
            }
            if (bad) {
                std::cerr << "no successor for vertex " << label_vertex(v) << " in extract_subgame!" << std::endl;
                std::cerr << "successors not in subgame:";
                for (auto curedge = outs(v); *curedge != -1; curedge++) {
                    std::cerr << " " << label_vertex(*curedge);
                }
                std::cerr << std::endl;
                abort(); // bad!
            }
        }
    }

    auto res = std::make_unique<Game>(nv, ne);

    // create mapping from game to subgame
    // also count the number of vertices in the subgame
    std::map<int, int> game_to_subgame;
    subgame_to_game.assign(n_vertices, 0);

    int vertices = 0;
    for (int v=0; v<n_vertices; v++) {
        if (!mask[v]) continue;

        // update game_to_subgame and subgame_to_game
        int w = vertices++;
        subgame_to_game[w] = v;
        game_to_subgame[v] = w;

        // initialize most stuff (except edges)
        if (_label[v] != 0) res->init_vertex(w, _priority[v], _owner[v], *_label[v]);
        else res->init_vertex(w, _priority[v], _owner[v], "");
    }

    // now add all edges

    for (int w=0; w<nv; w++) {
        int v = subgame_to_game[w];
        res->e_start(w);
        for (auto curedge = outs(v); *curedge != -1; curedge++) {
            if (mask[*curedge]) res->e_add(w, game_to_subgame[*curedge]);
        }
        res->e_finish();
    }

    // TODO: fix is_ordered?

    return res;
}